

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O2

void spdlog::set_pattern(string *pattern,pattern_time_type time_type)

{
  pattern_formatter *this;
  allocator<char> local_61;
  _Head_base<0UL,_spdlog::formatter_*,_false> local_60;
  string local_58;
  string local_38;
  
  this = (pattern_formatter *)operator_new(0xa8);
  std::__cxx11::string::string((string *)&local_38,(string *)pattern);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"\n",&local_61);
  pattern_formatter::pattern_formatter(this,&local_38,time_type,&local_58);
  local_60._M_head_impl = (formatter *)this;
  set_formatter((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)&local_60)
  ;
  if ((pattern_formatter *)local_60._M_head_impl != (pattern_formatter *)0x0) {
    (*((formatter *)&(local_60._M_head_impl)->_vptr_formatter)->_vptr_formatter[1])();
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

SPDLOG_INLINE void set_pattern(std::string pattern, pattern_time_type time_type)
{
    set_formatter(std::unique_ptr<spdlog::formatter>(new pattern_formatter(std::move(pattern), time_type)));
}